

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,double *_value)

{
  long *plVar1;
  double local_20;
  float64_t tmp;
  
  if (_type - ValueTypeFLOAT64 < 2) {
    binary<double>::restore(_in,&local_20,SUB41(((this->options_).flags_ & 2U) >> 1,0));
    *_value = local_20;
    return;
  }
  *_value = 0.0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"unsupported conversion type to double: ",0x27);
  plVar1 = (long *)std::ostream::operator<<(&std::cerr,_type);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, double& _value) const {

    switch (_type) {

        case ValueTypeFLOAT64:

        case ValueTypeDOUBLE:

            float64_t tmp;
            restore(_in, tmp, options_.check(Options::MSB));
            _value = tmp;

            break;

    default:

        _value = 0.0;
        std::cerr << "unsupported conversion type to double: " << _type << std::endl;

        break;
    }
}